

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.nalg.c
# Opt level: O0

void pnga_copy(Integer g_a,Integer g_b)

{
  int iVar1;
  int iVar2;
  Integer *grp;
  void *grp_00;
  Integer IVar3;
  Integer IVar4;
  logical lVar5;
  Integer *pIVar6;
  void *pvVar7;
  Integer in_RSI;
  Integer in_RDI;
  Integer _hi [7];
  Integer _lo [7];
  Integer _ld [6];
  Integer _dims [7];
  _iterator_hdl hdl;
  int use_put;
  int local_sync_end;
  int local_sync_begin;
  char *ptr_b;
  char *ptr_a;
  Integer block_dims [7];
  Integer blocks [7];
  Integer num_blocks_b;
  Integer num_blocks_a;
  Integer bnproc;
  Integer anproc;
  Integer b_grp;
  Integer a_grp;
  Integer i;
  Integer dimsb [7];
  Integer me_b;
  Integer me_a;
  Integer typeb;
  Integer type;
  Integer ndimb;
  Integer ndim;
  Integer *in_stack_fffffffffffffab0;
  void *in_stack_fffffffffffffab8;
  Integer *in_stack_fffffffffffffac0;
  Integer *in_stack_fffffffffffffac8;
  Integer in_stack_fffffffffffffad0;
  Integer *in_stack_fffffffffffffae8;
  char **in_stack_fffffffffffffaf0;
  Integer *in_stack_fffffffffffffaf8;
  Integer *in_stack_fffffffffffffb00;
  _iterator_hdl *in_stack_fffffffffffffb08;
  _iterator_hdl *in_stack_fffffffffffffb78;
  Integer in_stack_fffffffffffffb80;
  Integer in_stack_fffffffffffffbd0;
  Integer in_stack_fffffffffffffc48;
  char *in_stack_fffffffffffffc50;
  Integer *in_stack_fffffffffffffc60;
  void *in_stack_fffffffffffffc68;
  Integer *in_stack_fffffffffffffc70;
  Integer *in_stack_fffffffffffffc78;
  Integer in_stack_fffffffffffffc80;
  Integer *in_stack_fffffffffffffcb8;
  Integer *in_stack_fffffffffffffcc0;
  Integer *in_stack_fffffffffffffcc8;
  Integer in_stack_fffffffffffffcd0;
  Integer *in_stack_fffffffffffffdb8;
  Integer *in_stack_fffffffffffffdc0;
  Integer in_stack_fffffffffffffdc8;
  Integer in_stack_fffffffffffffdd0;
  Integer *in_stack_fffffffffffffe90;
  void *in_stack_fffffffffffffe98;
  Integer *in_stack_fffffffffffffea0;
  Integer *in_stack_fffffffffffffea8;
  Integer in_stack_fffffffffffffeb0;
  long local_80;
  long local_78 [7];
  Integer local_40;
  Integer local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  Integer local_10;
  Integer local_8;
  
  iVar1 = _ga_sync_end;
  iVar2 = _ga_sync_begin;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  grp = (Integer *)pnga_get_pgroup(in_RDI);
  grp_00 = (void *)pnga_get_pgroup(local_10);
  local_38 = pnga_pgroup_nodeid((Integer)grp);
  local_40 = pnga_pgroup_nodeid((Integer)grp_00);
  IVar3 = pnga_get_pgroup_size((Integer)grp);
  IVar4 = pnga_get_pgroup_size((Integer)grp_00);
  pnga_total_blocks(local_8);
  pnga_total_blocks(local_10);
  if (iVar2 != 0) {
    if (IVar4 < IVar3) {
      in_stack_fffffffffffffac0 = grp;
      pIVar6 = (Integer *)pnga_pgroup_get_world();
      if ((in_stack_fffffffffffffac0 == pIVar6) &&
         (in_stack_fffffffffffffab8 = grp_00, pvVar7 = (void *)pnga_pgroup_get_world(),
         in_stack_fffffffffffffab8 == pvVar7)) {
        pnga_sync();
      }
      else {
        pnga_pgroup_sync((Integer)in_stack_fffffffffffffab0);
      }
    }
    else {
      pnga_pgroup_sync((Integer)in_stack_fffffffffffffab0);
    }
  }
  if (local_8 == local_10) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  pnga_inquire(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
  pnga_inquire(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
               in_stack_fffffffffffffcb8);
  if (local_28 != local_30) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  if (local_18 != local_20) {
    pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  }
  for (local_80 = 0; local_80 < local_18; local_80 = local_80 + 1) {
    if (*(long *)(&stack0xfffffffffffffb78 + local_80 * 8) != local_78[local_80]) {
      pnga_error(in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    }
  }
  lVar5 = pnga_is_mirrored(local_8);
  if (((lVar5 == 0) || (lVar5 = pnga_is_mirrored(local_10), lVar5 == 0)) &&
     ((lVar5 = pnga_is_mirrored(local_8), lVar5 != 0 ||
      (lVar5 = pnga_is_mirrored(local_10), lVar5 != 0)))) {
    lVar5 = pnga_is_mirrored(local_8);
    if (lVar5 == 0) {
      pnga_zero(in_stack_fffffffffffffbd0);
      pnga_distribution(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      if (0 < (long)in_stack_fffffffffffffb08) {
        pnga_access_ptr(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffe90);
        pnga_put(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
                 in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
      }
      pnga_merge_mirrored(in_stack_fffffffffffffc80);
    }
    else {
      pnga_distribution(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
      if (0 < (long)in_stack_fffffffffffffb08) {
        pnga_access_ptr(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                        in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                        in_stack_fffffffffffffe90);
        pnga_get(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                 in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
      }
    }
  }
  else if (IVar4 < IVar3) {
    pnga_local_iterator_init(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    while (iVar2 = pnga_local_iterator_next
                             (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                              in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                              in_stack_fffffffffffffae8), iVar2 != 0) {
      pnga_get(in_stack_fffffffffffffc80,in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
               in_stack_fffffffffffffc68,in_stack_fffffffffffffc60);
    }
  }
  else {
    pnga_local_iterator_init(in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
    while (iVar2 = pnga_local_iterator_next
                             (in_stack_fffffffffffffb08,in_stack_fffffffffffffb00,
                              in_stack_fffffffffffffaf8,in_stack_fffffffffffffaf0,
                              in_stack_fffffffffffffae8), iVar2 != 0) {
      pnga_put(in_stack_fffffffffffffad0,in_stack_fffffffffffffac8,in_stack_fffffffffffffac0,
               in_stack_fffffffffffffab8,in_stack_fffffffffffffab0);
    }
  }
  if (iVar1 != 0) {
    if (IVar4 < IVar3) {
      pIVar6 = (Integer *)pnga_pgroup_get_world();
      if ((grp == pIVar6) && (pvVar7 = (void *)pnga_pgroup_get_world(), grp_00 == pvVar7)) {
        pnga_sync();
      }
      else {
        pnga_pgroup_sync((Integer)grp);
      }
    }
    else {
      pnga_pgroup_sync((Integer)in_stack_fffffffffffffab0);
    }
  }
  return;
}

Assistant:

void pnga_copy(Integer g_a, Integer g_b)
{
Integer  ndim, ndimb, type, typeb, me_a, me_b;
Integer dimsb[MAXDIM],i;
Integer a_grp, b_grp, anproc, bnproc;
Integer num_blocks_a, num_blocks_b;
Integer blocks[MAXDIM], block_dims[MAXDIM];
char *ptr_a, *ptr_b;
int local_sync_begin,local_sync_end,use_put;
_iterator_hdl hdl;


   Integer _dims[MAXDIM];
   Integer _ld[MAXDIM-1];
   Integer _lo[MAXDIM];
   Integer _hi[MAXDIM];
   local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   a_grp = pnga_get_pgroup(g_a);
   b_grp = pnga_get_pgroup(g_b);
   me_a = pnga_pgroup_nodeid(a_grp);
   me_b = pnga_pgroup_nodeid(b_grp);
   anproc = pnga_get_pgroup_size(a_grp);
   bnproc = pnga_get_pgroup_size(b_grp);
   num_blocks_a = pnga_total_blocks(g_a);
   num_blocks_b = pnga_total_blocks(g_b);
   if (anproc <= bnproc) {
     use_put = 1;
   } else {
     use_put = 0;
   }
   /*if (a_grp != b_grp)
     pnga_error("Both arrays must be defined on same group",0L); */
   if(local_sync_begin) {
     if (anproc <= bnproc) {
       pnga_pgroup_sync(a_grp);
     } else if (a_grp == pnga_pgroup_get_world() &&
                b_grp == pnga_pgroup_get_world()) {
       pnga_sync();
     } else {
       pnga_pgroup_sync(b_grp);
     }
   }

   if(g_a == g_b) pnga_error("arrays have to be different ", 0L);

   pnga_inquire(g_a,  &type, &ndim, _dims);
   pnga_inquire(g_b,  &typeb, &ndimb, dimsb);

   if(type != typeb) pnga_error("types not the same", g_b);
   if(ndim != ndimb) pnga_error("dimensions not the same", ndimb);

   for(i=0; i< ndim; i++)if(_dims[i]!=dimsb[i]) 
                          pnga_error("dimensions not the same",i);

   if ((pnga_is_mirrored(g_a) && pnga_is_mirrored(g_b)) ||
       (!pnga_is_mirrored(g_a) && !pnga_is_mirrored(g_b))) {
     /* Both global arrays are mirrored or both global arrays are not mirrored.
        Copy operation is straightforward */

     if (use_put) {
#if 0
       if (num_blocks_a < 0) {
         pnga_distribution(g_a, me_a, _lo, _hi);
         if(_lo[0]>0){
           pnga_access_ptr(g_a, _lo, _hi, &ptr_a, _ld);
           pnga_put(g_b, _lo, _hi, ptr_a, _ld);
         }
       } else {
         if (!pnga_uses_proc_grid(g_a)) {
           for (i=me_a; i<num_blocks_a; i += anproc) {
             pnga_distribution(g_a, i, _lo, _hi);
             if (_lo[0]>0) {
               pnga_access_block_ptr(g_a, i, &ptr_a, _ld);
               pnga_put(g_b, _lo, _hi, ptr_a, _ld);
             }
           }
         } else {
           Integer proc_index[MAXDIM], index[MAXDIM];
           Integer topology[MAXDIM], chk;
           pnga_get_proc_index(g_a, me_a, proc_index);
           pnga_get_proc_index(g_a, me_a, index);
           pnga_get_block_info(g_a, blocks, block_dims);
           pnga_get_proc_grid(g_a, topology);
           while (index[ndim-1] < blocks[ndim-1]) {
             /* find bounding coordinates of block */
             chk = 1;
             for (i = 0; i < ndim; i++) {
               _lo[i] = index[i]*block_dims[i]+1;
               _hi[i] = (index[i] + 1)*block_dims[i];
               if (_hi[i] > _dims[i]) _hi[i] = _dims[i];
               if (_hi[i] < _lo[i]) chk = 0;
             }
             if (chk) {
               pnga_access_block_grid_ptr(g_a, index, &ptr_a, _ld);
               pnga_put(g_b, _lo, _hi, ptr_a, _ld);
             }
             /* increment index to get next block on processor */
             index[0] += topology[0];
             for (i = 0; i < ndim; i++) {
               if (index[i] >= blocks[i] && i<ndim-1) {
                 index[i] = proc_index[i];
                 index[i+1] += topology[i+1];
               }
             }
           }
         }
       }
#else
       pnga_local_iterator_init(g_a, &hdl);
       while (pnga_local_iterator_next(&hdl,_lo,_hi,&ptr_a,_ld)) {
         pnga_put(g_b, _lo, _hi, ptr_a, _ld);
       }
#endif
     } else {
#if 0
       if (num_blocks_b < 0) {
         pnga_distribution(g_b, me_b, _lo, _hi);
         if(_lo[0]>0){
           pnga_access_ptr(g_b, _lo, _hi, &ptr_b, _ld);
           pnga_get(g_a, _lo, _hi, ptr_b, _ld);
         }
       } else {
         if (!pnga_uses_proc_grid(g_a)) {
           for (i=me_b; i<num_blocks_b; i += bnproc) {
             pnga_distribution(g_b, i, _lo, _hi);
             if (_lo[0]>0) {
               pnga_access_block_ptr(g_b, i, &ptr_b, _ld);
               pnga_get(g_a, _lo, _hi, ptr_b, _ld);
             }
           }
         } else {
           Integer proc_index[MAXDIM], index[MAXDIM];
           Integer topology[MAXDIM], chk;
           pnga_get_proc_index(g_b, me_b, proc_index);
           pnga_get_proc_index(g_b, me_b, index);
           pnga_get_block_info(g_b, blocks, block_dims);
           pnga_get_proc_grid(g_b, topology);
           while (index[ndim-1] < blocks[ndim-1]) {
             /* find bounding coordinates of block */
             chk = 1;
             for (i = 0; i < ndim; i++) {
               _lo[i] = index[i]*block_dims[i]+1;
               _hi[i] = (index[i] + 1)*block_dims[i];
               if (_hi[i] > _dims[i]) _hi[i] = _dims[i];
               if (_hi[i] < _lo[i]) chk = 0;
             }
             if (chk) {
               pnga_access_block_grid_ptr(g_b, index, &ptr_b, _ld);
               pnga_get(g_a, _lo, _hi, ptr_b, _ld);
             }
             /* increment index to get next block on processor */
             index[0] += topology[0];
             for (i = 0; i < ndim; i++) {
               if (index[i] >= blocks[i] && i<ndim-1) {
                 index[i] = proc_index[i];
                 index[i+1] += topology[i+1];
               }
             }
           }
         }
       }
#else
       pnga_local_iterator_init(g_b, &hdl);
       while (pnga_local_iterator_next(&hdl,_lo,_hi,&ptr_b,_ld)) {
         pnga_get(g_a, _lo, _hi, ptr_b, _ld);
       }
#endif
     }
   } else {
     /* One global array is mirrored and the other is not */
     if (pnga_is_mirrored(g_a)) {
       /* Source array is mirrored and destination
          array is distributed. Assume source array is consistent */
       pnga_distribution(g_b, me_b, _lo, _hi);
       if (_lo[0]>0) {
         pnga_access_ptr(g_b, _lo, _hi, &ptr_b, _ld);
         pnga_get(g_a, _lo, _hi, ptr_b, _ld);
       } 
     } else {
       /* source array is distributed and destination
          array is mirrored */
       pnga_zero(g_b);
       pnga_distribution(g_a, me_a, _lo, _hi);
       if (_lo[0] > 0) {
         pnga_access_ptr(g_a, _lo, _hi, &ptr_a, _ld);
         pnga_put(g_b, _lo, _hi, ptr_a, _ld);
       }
       pnga_merge_mirrored(g_b);
     }
   }

   if(local_sync_end) {
     if (anproc <= bnproc) {
       pnga_pgroup_sync(a_grp);
     } else if (a_grp == pnga_pgroup_get_world() &&
                b_grp == pnga_pgroup_get_world()) {
       pnga_sync();
     } else {
       pnga_pgroup_sync(b_grp);
     }
   }
}